

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUGD20HM303D.cpp
# Opt level: O0

bool __thiscall RTIMUGD20HM303D::setGyroSampleRate(RTIMUGD20HM303D *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uchar local_1a;
  byte local_19;
  uchar lowOdr;
  uchar ctrl1;
  RTIMUGD20HM303D *this_local;
  
  local_1a = '\0';
  switch(((this->super_RTIMU).m_settings)->m_GD20HM303DGyroSampleRate) {
  case 0:
    local_19 = 0xf;
    local_1a = '\x01';
    (this->super_RTIMU).m_sampleRate = 0xd;
    break;
  case 1:
    local_19 = 0x4f;
    local_1a = '\x01';
    (this->super_RTIMU).m_sampleRate = 0x19;
    break;
  case 2:
    local_19 = 0x8f;
    local_1a = '\x01';
    (this->super_RTIMU).m_sampleRate = 0x32;
    break;
  case 3:
    local_19 = 0xf;
    (this->super_RTIMU).m_sampleRate = 100;
    break;
  case 4:
    local_19 = 0x4f;
    (this->super_RTIMU).m_sampleRate = 200;
    break;
  case 5:
    local_19 = 0x8f;
    (this->super_RTIMU).m_sampleRate = 400;
    break;
  case 6:
    local_19 = 0xcf;
    (this->super_RTIMU).m_sampleRate = 800;
    break;
  default:
    fprintf(_stderr,"Illegal L3GD20H sample rate code %d\n",
            (ulong)(uint)((this->super_RTIMU).m_settings)->m_GD20HM303DGyroSampleRate);
    return false;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(this->super_RTIMU).m_sampleRate;
  (this->super_RTIMU).m_sampleInterval = SUB168((ZEXT816(0) << 0x40 | ZEXT816(1000000)) / auVar1,0);
  switch(((this->super_RTIMU).m_settings)->m_GD20HM303DGyroBW) {
  case 0:
    break;
  case 1:
    local_19 = local_19 | 0x10;
    break;
  case 2:
    local_19 = local_19 | 0x20;
    break;
  case 3:
    local_19 = local_19 | 0x30;
  }
  bVar2 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_gyroSlaveAddr
                             ,'9',local_1a,"Failed to set L3GD20H LOW_ODR");
  if (bVar2) {
    this_local._7_1_ =
         RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_gyroSlaveAddr,
                            ' ',local_19,"Failed to set L3GD20H CTRL1");
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool RTIMUGD20HM303D::setGyroSampleRate()
{
    unsigned char ctrl1;
    unsigned char lowOdr = 0;

    switch (m_settings->m_GD20HM303DGyroSampleRate) {
    case L3GD20H_SAMPLERATE_12_5:
        ctrl1 = 0x0f;
        lowOdr = 1;
        m_sampleRate = 13;
        break;

    case L3GD20H_SAMPLERATE_25:
        ctrl1 = 0x4f;
        lowOdr = 1;
        m_sampleRate = 25;
        break;

    case L3GD20H_SAMPLERATE_50:
        ctrl1 = 0x8f;
        lowOdr = 1;
        m_sampleRate = 50;
        break;

    case L3GD20H_SAMPLERATE_100:
        ctrl1 = 0x0f;
        m_sampleRate = 100;
        break;

    case L3GD20H_SAMPLERATE_200:
        ctrl1 = 0x4f;
        m_sampleRate = 200;
        break;

    case L3GD20H_SAMPLERATE_400:
        ctrl1 = 0x8f;
        m_sampleRate = 400;
        break;

    case L3GD20H_SAMPLERATE_800:
        ctrl1 = 0xcf;
        m_sampleRate = 800;
        break;

    default:
        HAL_ERROR1("Illegal L3GD20H sample rate code %d\n", m_settings->m_GD20HM303DGyroSampleRate);
        return false;
    }

    m_sampleInterval = (uint64_t)1000000 / m_sampleRate;

    switch (m_settings->m_GD20HM303DGyroBW) {
    case L3GD20H_BANDWIDTH_0:
        ctrl1 |= 0x00;
        break;

    case L3GD20H_BANDWIDTH_1:
        ctrl1 |= 0x10;
        break;

    case L3GD20H_BANDWIDTH_2:
        ctrl1 |= 0x20;
        break;

    case L3GD20H_BANDWIDTH_3:
        ctrl1 |= 0x30;
        break;

    }

    if (!m_settings->HALWrite(m_gyroSlaveAddr, L3GD20H_LOW_ODR, lowOdr, "Failed to set L3GD20H LOW_ODR"))
        return false;

    return (m_settings->HALWrite(m_gyroSlaveAddr, L3GD20H_CTRL1, ctrl1, "Failed to set L3GD20H CTRL1"));
}